

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SSLTest_CertThenKeyMismatch_Test::TestBody
          (SSLTest_CertThenKeyMismatch_Test *this)

{
  bool bVar1;
  int iVar2;
  SSL_METHOD *meth;
  pointer psVar3;
  char *pcVar4;
  X509 *x;
  EVP_PKEY *pkey;
  EVP_PKEY *rhs;
  char *in_R9;
  AssertHelper local_288;
  Message local_280;
  undefined1 local_278 [8];
  AssertionResult gtest_ar;
  AssertHelper local_248;
  Message local_240;
  bool local_231;
  undefined1 local_230 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_200;
  Message local_1f8;
  bool local_1e9;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_1b8;
  Message local_1b0;
  bool local_1a1;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_170;
  Message local_168;
  int local_15c;
  undefined1 local_158 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_128;
  Message local_120;
  bool local_111;
  undefined1 local_110 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_e0;
  Message local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar__2;
  UniquePtr<X509> leaf;
  AssertHelper local_98;
  Message local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar__1;
  UniquePtr<EVP_PKEY> key;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<SSL_CTX> ctx;
  SSLTest_CertThenKeyMismatch_Test *this_local;
  
  meth = (SSL_METHOD *)TLS_method();
  psVar3 = (pointer)SSL_CTX_new(meth);
  std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_ctx_st,bssl::internal::Deleter> *)&gtest_ar_.message_,psVar3);
  testing::AssertionResult::AssertionResult<std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)0x4d86cd,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1312,pcVar4);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (bVar1) {
    GetTestKey();
    testing::AssertionResult::AssertionResult<std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_88,
               (unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_,(type *)0x0
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
    if (!bVar1) {
      testing::Message::Message(&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&leaf,(internal *)local_88,(AssertionResult *)0x53d8b1,"false","true",
                 in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1315,pcVar4);
      testing::internal::AssertHelper::operator=(&local_98,&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      std::__cxx11::string::~string((string *)&leaf);
      testing::Message::~Message(&local_90);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
    if (bVar1) {
      GetChainTestCertificate();
      testing::AssertionResult::AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
                ((AssertionResult *)local_d0,
                 (unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
      if (!bVar1) {
        testing::Message::Message(&local_d8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_d0,(AssertionResult *)"leaf",
                   "false","true",in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_e0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1317,pcVar4);
        testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_e0);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_d8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
      if (bVar1) {
        psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
        iVar2 = SSL_CTX_check_private_key((SSL_CTX *)psVar3);
        local_111 = iVar2 == 0;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_110,&local_111,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
        if (!bVar1) {
          testing::Message::Message(&local_120);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__4.message_,(internal *)local_110,
                     (AssertionResult *)"SSL_CTX_check_private_key(ctx.get())","true","false",in_R9)
          ;
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_128,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x131a,pcVar4);
          testing::internal::AssertHelper::operator=(&local_128,&local_120);
          testing::internal::AssertHelper::~AssertHelper(&local_128);
          std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
          testing::Message::~Message(&local_120);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
        psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
        x = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                              ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_
                              );
        local_15c = SSL_CTX_use_certificate((SSL_CTX *)psVar3,x);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_158,&local_15c,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
        if (!bVar1) {
          testing::Message::Message(&local_168);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__5.message_,(internal *)local_158,
                     (AssertionResult *)"SSL_CTX_use_certificate(ctx.get(), leaf.get())","false",
                     "true",in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_170,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x131d,pcVar4);
          testing::internal::AssertHelper::operator=(&local_170,&local_168);
          testing::internal::AssertHelper::~AssertHelper(&local_170);
          std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
          testing::Message::~Message(&local_168);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
        if (bVar1) {
          psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_
                             );
          iVar2 = SSL_CTX_check_private_key((SSL_CTX *)psVar3);
          local_1a1 = iVar2 == 0;
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_1a0,&local_1a1,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
          if (!bVar1) {
            testing::Message::Message(&local_1b0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__6.message_,(internal *)local_1a0,
                       (AssertionResult *)"SSL_CTX_check_private_key(ctx.get())","true","false",
                       in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_1b8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x131e,pcVar4);
            testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
            testing::internal::AssertHelper::~AssertHelper(&local_1b8);
            std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
            testing::Message::~Message(&local_1b0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
          psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_
                             );
          pkey = (EVP_PKEY *)
                 std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)
                            &gtest_ar__1.message_);
          iVar2 = SSL_CTX_use_PrivateKey((SSL_CTX *)psVar3,pkey);
          local_1e9 = iVar2 == 0;
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_1e8,&local_1e9,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
          if (!bVar1) {
            testing::Message::Message(&local_1f8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__7.message_,(internal *)local_1e8,
                       (AssertionResult *)"SSL_CTX_use_PrivateKey(ctx.get(), key.get())","true",
                       "false",in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_200,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1321,pcVar4);
            testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
            testing::internal::AssertHelper::~AssertHelper(&local_200);
            std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
            testing::Message::~Message(&local_1f8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
          psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_
                             );
          iVar2 = SSL_CTX_check_private_key((SSL_CTX *)psVar3);
          local_231 = iVar2 == 0;
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_230,&local_231,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
          if (!bVar1) {
            testing::Message::Message(&local_240);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar.message_,(internal *)local_230,
                       (AssertionResult *)"SSL_CTX_check_private_key(ctx.get())","true","false",
                       in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_248,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1325,pcVar4);
            testing::internal::AssertHelper::operator=(&local_248,&local_240);
            testing::internal::AssertHelper::~AssertHelper(&local_248);
            std::__cxx11::string::~string((string *)&gtest_ar.message_);
            testing::Message::~Message(&local_240);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
          psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_
                             );
          rhs = SSL_CTX_get0_privatekey(psVar3);
          testing::internal::EqHelper::Compare<evp_pkey_st>
                    ((EqHelper *)local_278,"nullptr","SSL_CTX_get0_privatekey(ctx.get())",
                     (nullptr_t)0x0,rhs);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
          if (!bVar1) {
            testing::Message::Message(&local_280);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_278);
            testing::internal::AssertHelper::AssertHelper
                      (&local_288,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1326,pcVar4);
            testing::internal::AssertHelper::operator=(&local_288,&local_280);
            testing::internal::AssertHelper::~AssertHelper(&local_288);
            testing::Message::~Message(&local_280);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
        }
      }
      std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_);
    }
    std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
  }
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(SSLTest, CertThenKeyMismatch) {
  bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(ctx);

  bssl::UniquePtr<EVP_PKEY> key = GetTestKey();
  ASSERT_TRUE(key);
  bssl::UniquePtr<X509> leaf = GetChainTestCertificate();
  ASSERT_TRUE(leaf);

  // There is no key or certificate, so |SSL_CTX_check_private_key| fails.
  EXPECT_FALSE(SSL_CTX_check_private_key(ctx.get()));

  // With only a certificate, |SSL_CTX_check_private_key| still fails.
  ASSERT_TRUE(SSL_CTX_use_certificate(ctx.get(), leaf.get()));
  EXPECT_FALSE(SSL_CTX_check_private_key(ctx.get()));

  // The private key does not match the certificate, so it should fail.
  EXPECT_FALSE(SSL_CTX_use_PrivateKey(ctx.get(), key.get()));

  // Checking the private key fails, but this is really because there is still
  // no private key.
  EXPECT_FALSE(SSL_CTX_check_private_key(ctx.get()));
  EXPECT_EQ(nullptr, SSL_CTX_get0_privatekey(ctx.get()));
}